

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Parse3PCRE(int iters,char *regexp,StringPiece *text)

{
  bool bVar1;
  string *__lhs;
  ostream *poVar2;
  LogMessage local_3e8;
  Arg local_268;
  Arg local_258;
  Arg local_248;
  undefined1 local_238 [8];
  StringPiece sp3;
  StringPiece sp2;
  StringPiece sp1;
  undefined1 local_78 [8];
  PCRE re;
  int i;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  for (re.hit_limit_ = 0; re.hit_limit_ < iters; re.hit_limit_ = re.hit_limit_ + 1) {
    PCRE::PCRE((PCRE *)local_78,regexp,EnabledCompileOptions);
    __lhs = PCRE::error_abi_cxx11_((PCRE *)local_78);
    bVar1 = std::operator==(__lhs,"");
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sp1.length_,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x451);
      poVar2 = LogMessage::stream((LogMessage *)&sp1.length_);
      std::operator<<(poVar2,"Check failed: (re.error()) == (\"\")");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&sp1.length_);
    }
    StringPiece::StringPiece((StringPiece *)&sp2.length_);
    StringPiece::StringPiece((StringPiece *)&sp3.length_);
    StringPiece::StringPiece((StringPiece *)local_238);
    PCRE::Arg::Arg(&local_248,(StringPiece *)&sp2.length_);
    PCRE::Arg::Arg(&local_258,(StringPiece *)&sp3.length_);
    PCRE::Arg::Arg(&local_268,(StringPiece *)local_238);
    bVar1 = PCRE::FullMatchFunctor::operator()
                      ((FullMatchFunctor *)&PCRE::FullMatch,text,(PCRE *)local_78,&local_248,
                       &local_258,&local_268,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                       ,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                       ,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_3e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x453);
      poVar2 = LogMessage::stream(&local_3e8);
      std::operator<<(poVar2,"Check failed: PCRE::FullMatch(text, re, &sp1, &sp2, &sp3)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3e8);
    }
    PCRE::~PCRE((PCRE *)local_78);
  }
  return;
}

Assistant:

void Parse3PCRE(int iters, const char* regexp, const StringPiece& text) {
  for (int i = 0; i < iters; i++) {
    PCRE re(regexp, PCRE::UTF8);
    CHECK_EQ(re.error(), "");
    StringPiece sp1, sp2, sp3;
    CHECK(PCRE::FullMatch(text, re, &sp1, &sp2, &sp3));
  }
}